

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool __thiscall
bssl::anon_unknown_0::DecodeLowerHex
          (anon_unknown_0 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Span<const_char> in)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  
  pcVar4 = in.data_;
  if (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(ulong)pcVar4 >> 1);
    lVar3 = *(long *)this;
    bVar10 = *(long *)(this + 8) == lVar3;
    if (!bVar10) {
      pcVar5 = (char *)0x0;
      uVar6 = 0;
      do {
        if ((pcVar4 <= pcVar5) || (pcVar4 <= pcVar5 + 1)) {
          abort();
        }
        cVar1 = *(char *)((long)&(out->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar6 * 2);
        cVar2 = *(char *)((long)&(out->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar6 * 2 + 1);
        bVar8 = cVar1 - 0x30;
        if (9 < bVar8) {
          if (5 < (byte)(cVar1 + 0x9fU)) {
            return bVar10;
          }
          bVar8 = cVar1 + 0xa9;
        }
        bVar7 = cVar2 - 0x30;
        if (9 < bVar7) {
          if (5 < (byte)(cVar2 + 0x9fU)) {
            return bVar10;
          }
          bVar7 = cVar2 + 0xa9;
        }
        *(byte *)(lVar3 + uVar6) = bVar8 << 4 | bVar7;
        uVar6 = uVar6 + 1;
        lVar3 = *(long *)this;
        pcVar5 = pcVar5 + 2;
        bVar9 = uVar6 < (ulong)(*(long *)(this + 8) - lVar3);
        bVar10 = !bVar9;
      } while (bVar9);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool DecodeLowerHex(std::vector<uint8_t> *out,
                           bssl::Span<const char> in) {
  if (in.size() % 2 != 0) {
    return false;
  }
  out->resize(in.size() / 2);
  for (size_t i = 0; i < out->size(); i++) {
    char hi = in[2 * i], lo = in[2 * i + 1];
    uint8_t b = 0;
    if ('0' <= hi && hi <= '9') {
      b |= hi - '0';
    } else if ('a' <= hi && hi <= 'f') {
      b |= hi - 'a' + 10;
    } else {
      return false;
    }
    b <<= 4;
    if ('0' <= lo && lo <= '9') {
      b |= lo - '0';
    } else if ('a' <= lo && lo <= 'f') {
      b |= lo - 'a' + 10;
    } else {
      return false;
    }
    (*out)[i] = b;
  }
  return true;
}